

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_Edition_Test::
~FileDescriptorTest_Edition_Test(FileDescriptorTest_Edition_Test *this)

{
  FileDescriptorTest::~FileDescriptorTest(&this->super_FileDescriptorTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, Edition) {
  FileDescriptorProto proto;
  proto.set_name("foo");
  {
    proto.set_syntax("proto2");
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_PROTO2);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("", other.syntax());
    EXPECT_FALSE(other.has_edition());
  }
  {
    proto.set_syntax("proto3");
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_PROTO3);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("proto3", other.syntax());
    EXPECT_FALSE(other.has_edition());
  }
  {
    proto.set_syntax("editions");
    proto.set_edition(EDITION_2023);
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_2023);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("editions", other.syntax());
    EXPECT_EQ(other.edition(), EDITION_2023);
  }
}